

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_with_multiple_asset_fee_only_target_Test::TestBody
          (CoinSelection_SelectCoins_with_multiple_asset_fee_only_target_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  const_iterator scriptsig_template;
  Utxo *utxo;
  ulong uVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  key_type *__k;
  mapped_type_conflict *pmVar9;
  char *in_R9;
  Amount AVar10;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  Txid txid;
  TestElementsUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *__range1;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  reference in_stack_fffffffffffff828;
  CoinSelectionOption *in_stack_fffffffffffff830;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff838;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff840;
  char *in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  key_type *in_stack_fffffffffffff868;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  string local_648;
  AssertHelper local_628;
  Message local_620;
  string local_618;
  byte local_5f1;
  AssertionResult local_5f0;
  string local_5e0;
  AssertHelper local_5c0;
  Message local_5b8;
  string local_5b0;
  byte local_589;
  AssertionResult local_588;
  string local_578;
  AssertHelper local_558;
  Message local_550;
  string local_548;
  AssertionResult local_528;
  AssertHelper local_518;
  Message local_510;
  undefined4 local_504;
  size_type local_500;
  AssertionResult local_4f8;
  AssertHelper local_4e8;
  Message local_4e0;
  undefined4 local_4d4;
  int64_t local_4d0;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined4 local_4a4;
  string local_4a0;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  undefined4 local_45c;
  string local_458;
  AssertionResult local_438;
  AssertHelper local_428;
  Message local_420;
  undefined4 local_414;
  string local_410;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined4 local_3cc;
  size_type local_3c8;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined8 local_3a0;
  AssertionResult local_398;
  AssertHelper local_388;
  Message local_380;
  undefined8 local_378;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  undefined8 local_350;
  AssertionResult local_348;
  AssertHelper local_338;
  Message local_330;
  undefined8 local_328;
  AssertionResult local_320;
  AssertHelper local_310;
  Message local_308;
  undefined8 local_300;
  AssertionResult local_2f8;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined4 local_2d4;
  size_type local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0 [5];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_288;
  int64_t local_270;
  undefined1 local_268;
  int64_t local_260;
  undefined1 local_258;
  pointer in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  Amount *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  uint32_t in_stack_fffffffffffffddc;
  Txid *in_stack_fffffffffffffde0;
  __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
  local_200;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *local_1f8;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_1f0 [4];
  char local_1d0 [104];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_168 [2];
  uint64_t local_138;
  undefined1 local_130;
  uint64_t local_128;
  uint8_t local_120;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_118 [2];
  string local_d8;
  CoinSelectionOption *in_stack_ffffffffffffff48;
  UtxoFilter *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  CoinSelection *in_stack_ffffffffffffff68;
  string local_88 [8];
  Amount *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffff98;
  AmountMap *in_stack_ffffffffffffffa0;
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffff830,
             SUB81((ulong)in_stack_fffffffffffff828 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x275f7e);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_88,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                        in_stack_fffffffffffff868);
  *pmVar3 = 0x5f5db24;
  std::__cxx11::string::~string(local_88);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&stack0xffffffffffffff48,&exp_dummy_asset_b);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                        in_stack_fffffffffffff868);
  *pmVar3 = 0x14a7184a;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_d8,&exp_dummy_asset_c);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                        in_stack_fffffffffffff868);
  *pmVar3 = 0;
  std::__cxx11::string::~string((string *)&local_d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27607e);
  cfd::core::Amount::Amount((Amount *)local_118);
  AVar10 = cfd::core::Amount::CreateBySatoshiAmount(500);
  local_138 = AVar10.amount_;
  local_130 = AVar10.ignore_check_;
  local_128 = local_138;
  local_120 = local_130;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x2760f1);
  GetElementsOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffff830,(double)in_stack_fffffffffffff828);
  cfd::CoinSelectionOption::SetFeeAsset
            (in_stack_fffffffffffff830,(ConfidentialAssetId *)in_stack_fffffffffffff828);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x276142);
  std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::size
            (&kExtCoinSelectElementsTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
             CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (size_type)in_stack_fffffffffffff848);
  local_1f0[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff828
                         );
  local_1f8 = &kExtCoinSelectElementsTestVector;
  local_200._M_current =
       (TestElementsUtxoCoinVector *)
       std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::begin
                 ((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffff828);
  scriptsig_template =
       std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::end
                 ((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffff828);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffff830,
                            (__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffff828), bVar1) {
    utxo = (Utxo *)__gnu_cxx::
                   __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                   ::operator*(&local_200);
    cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffdd0);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffdb0,(string *)utxo);
      cfd::core::Txid::operator=((Txid *)&stack0xfffffffffffffdd0,(Txid *)&stack0xfffffffffffffdb0);
      cfd::core::Txid::~Txid((Txid *)0x27623e);
    }
    AVar10 = cfd::core::Amount::CreateBySatoshiAmount(*(uint64_t *)utxo->txid);
    local_270 = AVar10.amount_;
    local_268 = AVar10.ignore_check_;
    local_260 = local_270;
    local_258 = local_268;
    in_stack_fffffffffffff828 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(local_1f0);
    in_stack_fffffffffffff830 = (CoinSelectionOption *)0x0;
    in_R9 = (char *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,utxo,
               (Script *)scriptsig_template._M_current);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_1f0);
    cfd::core::Txid::~Txid((Txid *)0x276467);
    __gnu_cxx::
    __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
    ::operator++(&local_200);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x276498);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffff840 = local_168;
      in_stack_fffffffffffff838 = local_118;
      in_stack_fffffffffffff830 =
           (CoinSelectionOption *)
           &local_118[0].super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffff828 = (reference)&local_128;
      in_stack_fffffffffffff848 = (char *)0x0;
      in_R9 = local_1d0;
      cfd::CoinSelection::SelectCoins
                (in_stack_ffffffffffffff68,(AmountMap *)in_stack_ffffffffffffff60,
                 (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                 (AmountMap *)in_stack_ffffffffffffff88,(Amount *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff840);
    }
  }
  else {
    testing::Message::Message(local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x532,
               "Expected: ret = coin_select.SelectCoins( map_target_amount, utxos, exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2b8,local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x276626);
  }
  local_2d0 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_288);
  local_2d4 = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
             (unsigned_long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27671b);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x534,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message((Message *)0x27677e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2767d6);
  sVar6 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_288);
  if (sVar6 == 5) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_288,0);
    local_300 = 0x511f364;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (unsigned_long *)in_stack_fffffffffffff838,(long *)in_stack_fffffffffffff830);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2768a5);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x536,pcVar5);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::Message::~Message((Message *)0x276908);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27695d);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_288,1);
    local_328 = 0xe3f1de;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (unsigned_long *)in_stack_fffffffffffff838,(long *)in_stack_fffffffffffff830);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_320);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x276a16);
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x537,pcVar5);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      testing::Message::~Message((Message *)0x276a79);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x276ace);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_288,2);
    local_350 = 0x14a61a62;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (unsigned_long *)in_stack_fffffffffffff838,(long *)in_stack_fffffffffffff830);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x276b87);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x538,pcVar5);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      testing::Message::~Message((Message *)0x276bea);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x276c3f);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_288,3);
    local_378 = 750000;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (unsigned_long *)in_stack_fffffffffffff838,(long *)in_stack_fffffffffffff830);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar1) {
      testing::Message::Message(&local_380);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x276cf8);
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x539,pcVar5);
      testing::internal::AssertHelper::operator=(&local_388,&local_380);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      testing::Message::~Message((Message *)0x276d5b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x276db0);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_288,4);
    local_3a0 = 0x23e8eb8;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (unsigned_long *)in_stack_fffffffffffff838,(long *)in_stack_fffffffffffff830);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x276e69);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
      testing::Message::~Message((Message *)0x276ecc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x276f21);
  }
  local_3c8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x276f42);
  local_3cc = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
             (unsigned_long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x276fdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x53c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message((Message *)0x277042);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27709a);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x2770a7);
  if (sVar7 == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_410,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868);
    local_414 = 0x5f5e542;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
    std::__cxx11::string::~string((string *)&local_410);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2771c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_428,&local_420);
      testing::internal::AssertHelper::~AssertHelper(&local_428);
      testing::Message::~Message((Message *)0x277223);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27727b);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_458,&exp_dummy_asset_b);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868);
    local_45c = 0x14b18c12;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
    std::__cxx11::string::~string((string *)&local_458);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
    if (!bVar1) {
      testing::Message::Message(&local_468);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27738a);
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x53f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_470,&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      testing::Message::~Message((Message *)0x2773ed);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x277445);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4a0,&exp_dummy_asset_c);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868);
    local_4a4 = 0x23e8eb8;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
               (long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
    std::__cxx11::string::~string((string *)&local_4a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
    if (!bVar1) {
      testing::Message::Message(&local_4b0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x277554);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x540,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      testing::Message::~Message((Message *)0x2775b7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27760c);
  }
  local_4d0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_118);
  local_4d4 = 0x398;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
             (long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2776d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x542,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    testing::Message::~Message((Message *)0x27772d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x277782);
  local_500 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x27778f);
  local_504 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff848,(char *)in_stack_fffffffffffff840,
             (unsigned_long *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x277838);
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x543,pcVar5);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    testing::Message::~Message((Message *)0x277895);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2778ed);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x2778fa);
  if (sVar8 == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_548,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff830,(bool *)in_stack_fffffffffffff828,
               (type *)0x27794c);
    std::__cxx11::string::~string((string *)&local_548);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_528);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_550);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_578,(internal *)&local_528,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_558,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x545,pcVar5);
      testing::internal::AssertHelper::operator=(&local_558,&local_550);
      testing::internal::AssertHelper::~AssertHelper(&local_558);
      std::__cxx11::string::~string((string *)&local_578);
      testing::Message::~Message((Message *)0x277a77);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x277af2);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_5b0,&exp_dummy_asset_b);
    __k = (key_type *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)CONCAT17(uVar2,in_stack_fffffffffffff870),in_stack_fffffffffffff868);
    local_589 = ~(byte)__k->_M_dataplus & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff830,(bool *)in_stack_fffffffffffff828,
               (type *)0x277b4f);
    std::__cxx11::string::~string((string *)&local_5b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_588);
    if (!bVar1) {
      testing::Message::Message(&local_5b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5e0,(internal *)&local_588,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","true","false",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x546,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
      testing::internal::AssertHelper::~AssertHelper(&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      testing::Message::~Message((Message *)0x277c7a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x277cf5);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_618,&exp_dummy_asset_c);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)CONCAT17(uVar2,in_stack_fffffffffffff870),__k);
    local_5f1 = ~*pmVar9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff830,(bool *)in_stack_fffffffffffff828,
               (type *)0x277d52);
    std::__cxx11::string::~string((string *)&local_618);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
    if (!bVar1) {
      testing::Message::Message(&local_620);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_648,(internal *)&local_5f0,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_c.GetHex()]","true","false",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x547,pcVar5);
      testing::internal::AssertHelper::operator=(&local_628,&local_620);
      testing::internal::AssertHelper::~AssertHelper(&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      testing::Message::~Message((Message *)0x277e7d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x277ef5);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff840);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff840);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x277f2d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x277f3a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x277f47);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x277f54);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x277f61);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_with_multiple_asset_fee_only_target)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99998500;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 346495050;
  map_target_amount[exp_dummy_asset_c.GetHex()] = 0;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(2);
  option.SetFeeAsset(exp_dummy_asset_c);

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 5);
  if (ret.size() == 5) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(14938590));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(346430050));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[4].amount, static_cast<int64_t>(37654200));
  }
  EXPECT_EQ(map_select_value.size(), 3);
  if (map_select_value.size() == 3) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 347180050);
    EXPECT_EQ(map_select_value[exp_dummy_asset_c.GetHex()], 37654200);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 920);
  EXPECT_EQ(map_searched_bnb.size(), 3);
  if (map_searched_bnb.size() == 3) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_c.GetHex()]);
  }
}